

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

char * fmt::v9::detail::
       parse_width<char,fmt::v9::detail::specs_checker<fmt::v9::detail::dynamic_specs_handler<fmt::v9::basic_format_parse_context<char,fmt::v9::detail::error_handler>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v9::detail::dynamic_specs_handler<fmt::v9::basic_format_parse_context<char,_fmt::v9::detail::error_handler>_>_>
                 *handler)

{
  basic_format_parse_context<char,_fmt::v9::detail::error_handler> *pbVar1;
  dynamic_format_specs<char> *pdVar2;
  int iVar3;
  char *local_20;
  width_adapter local_18;
  
  local_20 = begin;
  if (begin == end) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O3/_deps/fmt-src/include/fmt/core.h"
                ,0x99b,"");
  }
  if ((byte)(*begin - 0x30U) < 10) {
    iVar3 = parse_nonnegative_int<char>(&local_20,end,-1);
    if (iVar3 == -1) {
      throw_format_error("number is too big");
    }
    ((handler->
     super_dynamic_specs_handler<fmt::v9::basic_format_parse_context<char,_fmt::v9::detail::error_handler>_>
     ).super_specs_setter<char>.specs_)->width = iVar3;
  }
  else if (*begin == '{') {
    local_20 = begin + 1;
    if (local_20 != end) {
      local_18.handler = handler;
      if ((*local_20 == ':') || (*local_20 == '}')) {
        pbVar1 = (handler->
                 super_dynamic_specs_handler<fmt::v9::basic_format_parse_context<char,_fmt::v9::detail::error_handler>_>
                 ).context_;
        iVar3 = pbVar1->next_arg_id_;
        if (iVar3 < 0) {
          throw_format_error("cannot switch from manual to automatic argument indexing");
        }
        pbVar1->next_arg_id_ = iVar3 + 1;
        pdVar2 = (handler->
                 super_dynamic_specs_handler<fmt::v9::basic_format_parse_context<char,_fmt::v9::detail::error_handler>_>
                 ).specs_;
        (pdVar2->width_ref).kind = index;
        (pdVar2->width_ref).val.index = iVar3;
      }
      else {
        local_20 = do_parse_arg_id<char,fmt::v9::detail::parse_width<char,fmt::v9::detail::specs_checker<fmt::v9::detail::dynamic_specs_handler<fmt::v9::basic_format_parse_context<char,fmt::v9::detail::error_handler>>>&>(char_const*,char_const*,fmt::v9::detail::specs_checker<fmt::v9::detail::dynamic_specs_handler<fmt::v9::basic_format_parse_context<char,fmt::v9::detail::error_handler>>>&)::width_adapter&>
                             (local_20,end,&local_18);
      }
    }
    if ((local_20 == end) || (*local_20 != '}')) {
      throw_format_error("invalid format string");
    }
    local_20 = local_20 + 1;
  }
  return local_20;
}

Assistant:

FMT_CONSTEXPR auto parse_width(const Char* begin, const Char* end,
                               Handler&& handler) -> const Char* {
  using detail::auto_id;
  struct width_adapter {
    Handler& handler;

    FMT_CONSTEXPR void operator()() { handler.on_dynamic_width(auto_id()); }
    FMT_CONSTEXPR void operator()(int id) { handler.on_dynamic_width(id); }
    FMT_CONSTEXPR void operator()(basic_string_view<Char> id) {
      handler.on_dynamic_width(id);
    }
    FMT_CONSTEXPR void on_error(const char* message) {
      if (message) handler.on_error(message);
    }
  };

  FMT_ASSERT(begin != end, "");
  if ('0' <= *begin && *begin <= '9') {
    int width = parse_nonnegative_int(begin, end, -1);
    if (width != -1)
      handler.on_width(width);
    else
      handler.on_error("number is too big");
  } else if (*begin == '{') {
    ++begin;
    if (begin != end) begin = parse_arg_id(begin, end, width_adapter{handler});
    if (begin == end || *begin != '}')
      return handler.on_error("invalid format string"), begin;
    ++begin;
  }
  return begin;
}